

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

int secp256k1_eckey_pubkey_tweak_mul
              (secp256k1_ecmult_context *ctx,secp256k1_ge *key,secp256k1_scalar *tweak)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  secp256k1_scalar zero;
  secp256k1_gej pt;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [104];
  undefined1 local_30 [16];
  int local_20;
  
  auVar2._0_4_ = -(uint)((int)tweak->d[2] == 0 && (int)tweak->d[0] == 0);
  auVar2._4_4_ = -(uint)(*(int *)((long)tweak->d + 0x14) == 0 && *(int *)((long)tweak->d + 4) == 0);
  auVar2._8_4_ = -(uint)((int)tweak->d[3] == 0 && (int)tweak->d[1] == 0);
  auVar2._12_4_ =
       -(uint)(*(int *)((long)tweak->d + 0x1c) == 0 && *(int *)((long)tweak->d + 0xc) == 0);
  iVar1 = movmskps(in_EAX,auVar2);
  if (iVar1 != 0xf) {
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    local_20 = key->infinity;
    local_98._0_8_ = (key->x).n[0];
    local_98._8_8_ = (key->x).n[1];
    local_98._16_8_ = (key->x).n[2];
    local_98._24_8_ = (key->x).n[3];
    local_98._32_8_ = (key->x).n[4];
    local_98._40_8_ = (key->y).n[0];
    local_98._48_8_ = (key->y).n[1];
    local_98._56_8_ = (key->y).n[2];
    local_98._64_8_ = (key->y).n[3];
    local_98._72_8_ = (key->y).n[4];
    local_98._80_8_ = 1;
    local_98._88_16_ = (undefined1  [16])0x0;
    local_30 = (undefined1  [16])0x0;
    secp256k1_ecmult(ctx,(secp256k1_gej *)local_98,(secp256k1_gej *)local_98,tweak,
                     (secp256k1_scalar *)local_b8);
    secp256k1_ge_set_gej(key,(secp256k1_gej *)local_98);
    return 1;
  }
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_is_zero(const secp256k1_scalar *a) {
    return (a->d[0] | a->d[1] | a->d[2] | a->d[3]) == 0;
}